

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tifuhash.cpp
# Opt level: O0

void tifuhash_64(void *key,int len,uint32_t seed,void *out)

{
  undefined1 auVar1 [16];
  int *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  uint32_t h [2];
  double seed32;
  uint32_t *state32;
  double *state;
  uint8_t buf [16];
  uint8_t *data;
  double denominator;
  double val;
  long i;
  double numerator;
  double local_c8;
  double local_c0;
  int local_98;
  int iStack_94;
  int local_90;
  int iStack_8c;
  long local_88;
  int *local_80;
  int local_74;
  double local_68;
  double *local_60;
  double local_58;
  long local_48;
  double local_40;
  double *local_38;
  long local_30;
  long local_28;
  double local_18;
  double local_10;
  double *local_8;
  
  auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,in_EDX);
  local_68 = auVar1._0_8_;
  local_88 = in_RDI;
  local_80 = in_RCX;
  local_74 = in_ESI;
  local_60 = (double *)&local_98;
  if ((local_68 != 0.0) || (NAN(local_68))) {
    local_c0 = pow(local_68 + 1.0 / local_68,0.3333333333333333);
  }
  else {
    local_c0 = 3.0;
  }
  *local_60 = local_c0;
  if ((local_68 != 0.0) || (NAN(local_68))) {
    local_c8 = pow(local_68 + 1.0 / local_68,0.14285714285714285);
  }
  else {
    local_c8 = 0.14285714285714285;
  }
  local_60[1] = local_c8;
  local_30 = (long)local_74;
  local_28 = local_88;
  local_40 = 1.0;
  local_38 = (double *)&local_98;
  for (local_48 = 0; local_48 < local_30; local_48 = local_48 + 1) {
    local_10 = (double)*(byte *)(local_28 + local_48);
    local_58 = (local_10 + 1.0 + (double)local_48) / local_38[1];
    local_8 = local_38;
    local_18 = local_40;
    *local_38 = local_40 / local_58 + *local_38;
    *local_8 = 1.0 / *local_8;
    local_8[1] = local_10 + local_8[1];
    local_8[1] = local_18 / local_8[1];
    local_40 = local_58 + 1.0;
  }
  *local_38 = (local_38[1] + 3.141592653589793) * *local_38;
  local_38[1] = (*local_38 + 2.718281828459045) * local_38[1];
  *local_80 = local_98 + iStack_8c;
  local_80[1] = iStack_94 + local_90;
  return;
}

Assistant:

void tifuhash_64 ( const void * key, int len,
                   uint32_t seed, void * out )
{
  const uint8_t * data = (const uint8_t *)key;
  uint8_t buf [16];
  double * state = (double*)buf;
  uint32_t * state32 = (uint32_t*)buf;
  double seed32 = (double)seed;

  setup( state, seed32 );
  round( data, len, state );

  uint32_t h[2];
  
  h[0] = state32[0] + state32[3];
  h[1] = state32[1] + state32[2];

  ((uint32_t*)out)[0] = h[0];
  ((uint32_t*)out)[1] = h[1];
}